

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O1

int __thiscall SightCheck::P_SightBlockLinesIterator(SightCheck *this,int x,int y)

{
  polyblock_t *ppVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FPolyObj *pFVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  int *piVar9;
  
  iVar3 = bmapwidth * y + x;
  bVar2 = true;
  if (this->portalfound == false) {
    bVar2 = PortalBlockmap.data.Array[y * PortalBlockmap.dx + x].containsLinkedPortals;
  }
  this->portalfound = bVar2;
  ppVar1 = PolyBlockMap[iVar3];
  bVar6 = PortalBlockmap.hasLinkedPolyPortals;
  if (ppVar1 == (polyblock_t *)0x0) {
    bVar6 = 0;
  }
  this->portalfound = (bool)(bVar6 | bVar2);
  iVar7 = 1;
  for (; ppVar1 != (polyblock_t *)0x0; ppVar1 = ppVar1->next) {
    pFVar5 = ppVar1->polyobj;
    if ((pFVar5 != (FPolyObj *)0x0) && (pFVar5->validcount != validcount)) {
      pFVar5->validcount = validcount;
      pFVar5 = ppVar1->polyobj;
      if ((pFVar5->Linedefs).Count != 0) {
        uVar8 = 0;
        do {
          bVar2 = P_SightCheckLine(this,(pFVar5->Linedefs).Array[uVar8]);
          if ((!bVar2) && (iVar7 = -1, this->portalfound != true)) {
            return 0;
          }
          uVar8 = uVar8 + 1;
          pFVar5 = ppVar1->polyobj;
        } while (uVar8 < (pFVar5->Linedefs).Count);
      }
    }
  }
  iVar4 = blockmaplump[(long)blockmap[iVar3] + 1];
  if (iVar4 != -1) {
    piVar9 = blockmaplump + (long)blockmap[iVar3] + 2;
    do {
      bVar2 = P_SightCheckLine(this,lines + iVar4);
      if ((!bVar2) && (iVar7 = -1, this->portalfound != true)) {
        return 0;
      }
      iVar4 = *piVar9;
      piVar9 = piVar9 + 1;
    } while (iVar4 != -1);
  }
  return iVar7;
}

Assistant:

int SightCheck::P_SightBlockLinesIterator (int x, int y)
{
	int offset;
	int *list;
	int res = 1;

	polyblock_t *polyLink;
	unsigned int i;
	extern polyblock_t **PolyBlockMap;

	offset = y*bmapwidth+x;

	// if any of the previous blocks may contain a portal we may abort the collection of lines here, but we may not abort the sight check.
	// (We still try to delay activating this for as long as possible.)
	portalfound = portalfound || PortalBlockmap(x, y).containsLinkedPortals;

	polyLink = PolyBlockMap[offset];
	portalfound |= (polyLink && PortalBlockmap.hasLinkedPolyPortals);
	while (polyLink)
	{
		if (polyLink->polyobj)
		{ // only check non-empty links
			if (polyLink->polyobj->validcount != validcount)
			{
				polyLink->polyobj->validcount = validcount;
				for (i = 0; i < polyLink->polyobj->Linedefs.Size(); i++)
				{
					if (!P_SightCheckLine(polyLink->polyobj->Linedefs[i]))
					{
						if (!portalfound) return 0;
						else res = -1;
					}
				}
			}
		}
		polyLink = polyLink->next;
	}

	offset = *(blockmap + offset);

	for (list = blockmaplump + offset + 1; *list != -1; list++)
	{
		if (!P_SightCheckLine (&lines[*list]))
		{
			if (!portalfound) return 0;
			else res = -1;
		}
	}

	return res;			// everything was checked
}